

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallel_sort.h
# Opt level: O2

void __thiscall
embree::ParallelRadixSort<unsigned_int,_unsigned_int>::tbbRadixIteration0
          (ParallelRadixSort<unsigned_int,_unsigned_int> *this,uint shift,uint *src,uint *dst,
          size_t threadIndex,size_t threadCount)

{
  int *piVar1;
  long lVar2;
  ulong uVar3;
  long lVar4;
  size_t i;
  
  lVar2 = *(long *)(this + 0x18);
  for (lVar4 = 0; lVar4 != 0x100; lVar4 = lVar4 + 1) {
    *(undefined4 *)(*(long *)this + threadIndex * 0x400 + lVar4 * 4) = 0;
  }
  lVar4 = *(long *)this;
  for (uVar3 = (lVar2 * threadIndex) / threadCount;
      uVar3 < ((threadIndex + 1) * lVar2) / threadCount; uVar3 = uVar3 + 1) {
    piVar1 = (int *)(threadIndex * 0x400 + lVar4 +
                    (ulong)(byte)(src[uVar3] >> ((byte)shift & 0x3f)) * 4);
    *piVar1 = *piVar1 + 1;
  }
  return;
}

Assistant:

void tbbRadixIteration0(const Key shift, 
                            const Ty* __restrict const src, 
                            Ty* __restrict const dst, 
                            const size_t threadIndex, const size_t threadCount)
    {
      const size_t startID = (threadIndex+0)*N/threadCount;
      const size_t endID   = (threadIndex+1)*N/threadCount;
      
      /* mask to extract some number of bits */
      const Key mask = BUCKETS-1;
      
      /* count how many items go into the buckets */
      for (size_t i=0; i<BUCKETS; i++)
        radixCount[threadIndex][i] = 0;

      /* iterate over src array and count buckets */
      unsigned int * __restrict const count = radixCount[threadIndex];
#if defined(__INTEL_COMPILER)
#pragma nounroll      
#endif
      for (size_t i=startID; i<endID; i++) {
#if defined(__64BIT__)
        const size_t index = ((size_t)(Key)src[i] >> (size_t)shift) & (size_t)mask;
#else
        const Key index = ((Key)src[i] >> shift) & mask;
#endif
        count[index]++;
      }
    }